

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# despot.cpp
# Opt level: O2

void despot::DESPOT::Backup(VNode *vnode)

{
  int iVar1;
  int iVar2;
  log_ostream *plVar3;
  ostream *poVar4;
  QNode *qnode;
  double dVar5;
  
  iVar1 = logging::level();
  if ((0 < iVar1) && (iVar1 = logging::level(), 3 < iVar1)) {
    plVar3 = logging::stream(4);
    poVar4 = std::operator<<(&plVar3->super_ostream,"- Backup ");
    poVar4 = std::ostream::_M_insert<void_const*>(poVar4);
    poVar4 = std::operator<<(poVar4," at depth ");
    iVar1 = VNode::depth(vnode);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar1);
    std::endl<char,std::char_traits<char>>(poVar4);
  }
  iVar1 = 0;
  while( true ) {
    iVar2 = logging::level();
    if ((0 < iVar2) && (iVar2 = logging::level(), 3 < iVar2)) {
      plVar3 = logging::stream(4);
      poVar4 = std::operator<<(&plVar3->super_ostream," Iter ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar1);
      poVar4 = std::operator<<(poVar4," ");
      poVar4 = std::ostream::_M_insert<void_const*>(poVar4);
      std::endl<char,std::char_traits<char>>(poVar4);
    }
    Update(vnode);
    qnode = VNode::parent(vnode);
    if (qnode == (QNode *)0x0) break;
    Update(qnode);
    iVar2 = logging::level();
    if ((0 < iVar2) && (iVar2 = logging::level(), 3 < iVar2)) {
      plVar3 = logging::stream(4);
      std::operator<<(&plVar3->super_ostream," Updated Q-node to (");
      dVar5 = QNode::lower_bound(qnode);
      poVar4 = std::ostream::_M_insert<double>(dVar5);
      std::operator<<(poVar4,", ");
      dVar5 = QNode::upper_bound(qnode);
      poVar4 = std::ostream::_M_insert<double>(dVar5);
      poVar4 = std::operator<<(poVar4,")");
      std::endl<char,std::char_traits<char>>(poVar4);
    }
    vnode = QNode::parent(qnode);
    iVar1 = iVar1 + 1;
  }
  iVar1 = logging::level();
  if ((0 < iVar1) && (iVar1 = logging::level(), 3 < iVar1)) {
    plVar3 = logging::stream(4);
    poVar4 = std::operator<<(&plVar3->super_ostream,"* Backup complete!");
    std::endl<char,std::char_traits<char>>(poVar4);
    return;
  }
  return;
}

Assistant:

void DESPOT::Backup(VNode* vnode) {
	int iter = 0;
	logd << "- Backup " << vnode << " at depth " << vnode->depth() << endl;
	while (true) {
		logd << " Iter " << iter << " " << vnode << endl;

		Update(vnode);

		QNode* parentq = vnode->parent();
		if (parentq == NULL) {
			break;
		}

		Update(parentq);
		logd << " Updated Q-node to (" << parentq->lower_bound() << ", "
			<< parentq->upper_bound() << ")" << endl;

		vnode = parentq->parent();
		iter++;
	}
	logd << "* Backup complete!" << endl;
}